

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

int __thiscall google::protobuf::FieldOptions::ByteSize(FieldOptions *this)

{
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar1;
  int iVar2;
  int iVar3;
  Type *value;
  uint uVar4;
  int i;
  int iVar5;
  
  uVar4 = this->_has_bits_[0];
  iVar5 = 0;
  iVar2 = 0;
  if ((char)uVar4 != '\0') {
    iVar2 = 0;
    if ((uVar4 & 1) != 0) {
      iVar2 = io::CodedOutputStream::VarintSize32SignExtended(this->ctype_);
      iVar2 = iVar2 + 1;
      uVar4 = this->_has_bits_[0];
    }
    iVar2 = (uVar4 >> 2 & 2) + (uVar4 >> 1 & 2) + (uVar4 & 2) + iVar2;
    if ((uVar4 & 0x10) != 0) {
      iVar3 = internal::WireFormatLite::StringSize(this->experimental_map_key_);
      iVar2 = iVar2 + iVar3 + 1;
      uVar4 = this->_has_bits_[0];
    }
    iVar2 = (uVar4 >> 4 & 2) + iVar2;
  }
  iVar3 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
  iVar2 = iVar2 + iVar3 * 2;
  for (; iVar5 < iVar3; iVar5 = iVar5 + 1) {
    value = internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption>::TypeHandler>
                      (&(this->uninterpreted_option_).super_RepeatedPtrFieldBase,iVar5);
    iVar3 = internal::WireFormatLite::MessageSizeNoVirtual<google::protobuf::UninterpretedOption>
                      (value);
    iVar2 = iVar2 + iVar3;
    iVar3 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
  }
  iVar5 = internal::ExtensionSet::ByteSize(&this->_extensions_);
  iVar5 = iVar5 + iVar2;
  pvVar1 = (this->_unknown_fields_).fields_;
  if ((pvVar1 != (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                  *)0x0) &&
     ((pvVar1->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (pvVar1->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    iVar2 = internal::WireFormat::ComputeUnknownFieldsSize(&this->_unknown_fields_);
    iVar5 = iVar5 + iVar2;
  }
  this->_cached_size_ = iVar5;
  return iVar5;
}

Assistant:

int FieldOptions::ByteSize() const {
  int total_size = 0;

  if (_has_bits_[0 / 32] & (0xffu << (0 % 32))) {
    // optional .google.protobuf.FieldOptions.CType ctype = 1 [default = STRING];
    if (has_ctype()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::EnumSize(this->ctype());
    }

    // optional bool packed = 2;
    if (has_packed()) {
      total_size += 1 + 1;
    }

    // optional bool lazy = 5 [default = false];
    if (has_lazy()) {
      total_size += 1 + 1;
    }

    // optional bool deprecated = 3 [default = false];
    if (has_deprecated()) {
      total_size += 1 + 1;
    }

    // optional string experimental_map_key = 9;
    if (has_experimental_map_key()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->experimental_map_key());
    }

    // optional bool weak = 10 [default = false];
    if (has_weak()) {
      total_size += 1 + 1;
    }

  }
  // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
  total_size += 2 * this->uninterpreted_option_size();
  for (int i = 0; i < this->uninterpreted_option_size(); i++) {
    total_size +=
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        this->uninterpreted_option(i));
  }

  total_size += _extensions_.ByteSize();

  if (!unknown_fields().empty()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = total_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}